

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_global(Context *ctx,RegisterType regtype,int regnum)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  size_t in_R8;
  char varname [64];
  char regnum_str [16];
  char acStack_68 [64];
  char local_28 [16];
  
  pcVar1 = get_D3D_register_string(ctx,regtype,regnum,local_28,in_R8);
  snprintf(acStack_68,0x40,"%s%s",pcVar1,local_28);
  push_output(ctx,&ctx->mainline_top);
  ctx->indent = ctx->indent + 1;
  if ((int)regtype < 0xf) {
    if (regtype == REG_TYPE_TEMP) {
      pcVar1 = "float4 %s;";
    }
    else {
      if (regtype != REG_TYPE_ADDRESS) goto LAB_0010f91c;
      if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
        bVar3 = 0;
        if (ctx->minor_ver != 0xff) {
          bVar3 = ctx->minor_ver;
        }
        if (((uint)bVar3 | (uint)ctx->major_ver << 0x10) < 0x10004) {
          output_line(ctx,"float4 %s = input.%s;",acStack_68);
        }
        goto LAB_0010f934;
      }
      if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) goto LAB_0010f934;
      pcVar1 = "int4 %s;";
    }
  }
  else {
    if ((regtype == REG_TYPE_LOOP) || (regtype == REG_TYPE_LABEL)) goto LAB_0010f934;
    if (regtype != REG_TYPE_MAX) {
LAB_0010f91c:
      failf(ctx,"%s","BUG: we used a register we don\'t know how to define.");
      goto LAB_0010f934;
    }
    pcVar1 = "bool4 %s;";
  }
  output_line(ctx,pcVar1,acStack_68);
LAB_0010f934:
  lVar2 = (long)ctx->output_stack_len;
  if (0 < lVar2) {
    ctx->output_stack_len = (int)(lVar2 - 1U);
    ctx->output = ctx->output_stack[lVar2 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar2 + -1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_METAL_global(Context *ctx, RegisterType regtype, int regnum)
{
    char varname[64];
    get_METAL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    // These aren't actually global in metal, set them up at top of mainline.
    push_output(ctx, &ctx->mainline_top);
    ctx->indent++;

    switch (regtype)
    {
        case REG_TYPE_ADDRESS:
            if (shader_is_vertex(ctx))
                output_line(ctx, "int4 %s;", varname);
            else if (shader_is_pixel(ctx))  // actually REG_TYPE_TEXTURE.
            {
                // We have to map texture registers to temps for ps_1_1, since
                //  they work like temps, initialize with tex coords, and the
                //  ps_1_1 TEX opcode expects to overwrite it.
                if (!shader_version_atleast(ctx, 1, 4))
                    output_line(ctx, "float4 %s = input.%s;",varname,varname);
            } // else if
            break;
        case REG_TYPE_PREDICATE:
            output_line(ctx, "bool4 %s;", varname);
            break;
        case REG_TYPE_TEMP:
            output_line(ctx, "float4 %s;", varname);
            break;
        case REG_TYPE_LOOP:
            break; // no-op. We declare these in for loops at the moment.
        case REG_TYPE_LABEL:
            break; // no-op. If we see it here, it means we optimized it out.
        default:
            fail(ctx, "BUG: we used a register we don't know how to define.");
            break;
    } // switch

    pop_output(ctx);
}